

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstEvaluateVisitor.cpp
# Opt level: O0

void __thiscall
IRT::ConstEvaluateVisitor::Visit(ConstEvaluateVisitor *this,CConstExpression *expression)

{
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20;
  CConstExpression *local_18;
  CConstExpression *expression_local;
  ConstEvaluateVisitor *this_local;
  
  local_18 = expression;
  expression_local = (CConstExpression *)this;
  (*(expression->super_CExpression).super_IExpression.super_INode._vptr_INode[3])(&local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
            (&this->childExpression,&local_20);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void IRT::ConstEvaluateVisitor::Visit(const IRT::CConstExpression &expression) {
    childExpression = M(expression.Copy());
}